

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS.cpp
# Opt level: O2

NS * __thiscall NS::get_all(NS *__return_storage_ptr__,NS *this,Prep preposition)

{
  pointer ppNVar1;
  N *__args;
  bool bVar2;
  pointer ppNVar3;
  
  (__return_storage_ptr__->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppNVar1 = (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar3 = (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar3 != ppNVar1; ppNVar3 = ppNVar3 + 1) {
    __args = *ppNVar3;
    bVar2 = std::function<bool_(N_*)>::operator()(preposition,__args);
    if (bVar2) {
      add(__return_storage_ptr__,__args);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NS NS::get_all(Prep preposition) {
    NS res;
    for (auto n : _os) if (preposition(n)) res.add(n);
    return res;
}